

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O0

bool __thiscall
JsUtil::ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer> *this,void **item)

{
  bool bVar1;
  int local_24;
  int i;
  void **item_local;
  ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer> *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->count <= local_24) {
      return false;
    }
    bVar1 = DefaultComparer<void_*>::Equals(*item,this->buffer[local_24]);
    if (bVar1) break;
    local_24 = local_24 + 1;
  }
  return true;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }